

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenSwitch(BinaryenModuleRef module,char **names,BinaryenIndex numNames,char *defaultName,
              BinaryenExpressionRef condition,BinaryenExpressionRef value)

{
  ArenaVector<wasm::Name> *this;
  Name local_68;
  string_view local_58;
  uint local_44;
  Switch *pSStack_40;
  BinaryenIndex i;
  Switch *ret;
  BinaryenExpressionRef value_local;
  BinaryenExpressionRef condition_local;
  char *defaultName_local;
  char **ppcStack_18;
  BinaryenIndex numNames_local;
  char **names_local;
  BinaryenModuleRef module_local;
  
  ret = (Switch *)value;
  value_local = condition;
  condition_local = (BinaryenExpressionRef)defaultName;
  defaultName_local._4_4_ = numNames;
  ppcStack_18 = names;
  names_local = (char **)module;
  pSStack_40 = MixedArena::alloc<wasm::Switch>(&module->allocator);
  for (local_44 = 0; local_44 < defaultName_local._4_4_; local_44 = local_44 + 1) {
    this = &pSStack_40->targets;
    wasm::Name::Name((Name *)&local_58,ppcStack_18[local_44]);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              (&this->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(Name)local_58);
  }
  wasm::Name::Name(&local_68,(char *)condition_local);
  wasm::Name::operator=(&pSStack_40->default_,&local_68);
  pSStack_40->condition = value_local;
  pSStack_40->value = (Expression *)ret;
  wasm::Switch::finalize(pSStack_40);
  return (BinaryenExpressionRef)pSStack_40;
}

Assistant:

BinaryenExpressionRef BinaryenSwitch(BinaryenModuleRef module,
                                     const char** names,
                                     BinaryenIndex numNames,
                                     const char* defaultName,
                                     BinaryenExpressionRef condition,
                                     BinaryenExpressionRef value) {
  auto* ret = ((Module*)module)->allocator.alloc<Switch>();
  for (BinaryenIndex i = 0; i < numNames; i++) {
    ret->targets.push_back(names[i]);
  }
  ret->default_ = defaultName;
  ret->condition = (Expression*)condition;
  ret->value = (Expression*)value;
  ret->finalize();
  return static_cast<Expression*>(ret);
}